

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

uint32 __thiscall Clasp::UncoreMinimize::analyze(UncoreMinimize *this,Solver *s)

{
  bool bVar1;
  uint32 uVar2;
  Literal LVar3;
  reference pLVar4;
  uint32 *puVar5;
  iterator pLVar6;
  iterator pLVar7;
  Solver *in_RSI;
  long in_RDI;
  const_iterator end_2;
  const_iterator it_2;
  Literal p_1;
  iterator end_1;
  iterator it_1;
  uint32 dl;
  uint32 roots;
  const_iterator end;
  const_iterator it;
  LitPair p;
  uint32 minDL;
  uint32 cs;
  Literal *in_stack_ffffffffffffff38;
  Var v;
  Solver *in_stack_ffffffffffffff40;
  Solver *in_stack_ffffffffffffff48;
  Solver *in_stack_ffffffffffffff50;
  Literal *local_80;
  LitPair local_70;
  undefined4 in_stack_ffffffffffffff98;
  Literal in_stack_ffffffffffffff9c;
  Solver *in_stack_ffffffffffffffa0;
  iterator local_58;
  uint32 local_48;
  iterator local_38;
  LitPair local_28;
  uint32 local_20;
  uint32 local_1c;
  undefined8 local_18;
  uint32 local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  local_20 = Solver::decisionLevel((Solver *)0x1b465c);
  bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xa8))
  ;
  if (!bVar1) {
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (in_RDI + 0xa8),0);
    LVar3.rep_ = pLVar4->rep_;
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (in_RDI + 0xa8),1);
    puVar5 = Literal::rep(pLVar4);
    LitPair::LitPair(&local_28,LVar3,*puVar5);
    getData((UncoreMinimize *)in_stack_ffffffffffffff40,
            (uint32)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    Todo::add((Todo *)in_stack_ffffffffffffff50,(LitPair *)in_stack_ffffffffffffff48,
              (weight_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    Literal::var(&local_28.lit);
    local_20 = Solver::level(in_stack_ffffffffffffff40,
                             (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    local_1c = 1;
  }
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xa8));
  uVar2 = Solver::decisionLevel((Solver *)0x1b4753);
  if (*(uint *)(in_RDI + 0xf8) < uVar2) {
    Solver::resolveToCore
              (in_stack_ffffffffffffffa0,
               (LitVec *)CONCAT44(in_stack_ffffffffffffff9c.rep_,in_stack_ffffffffffffff98));
    local_38 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                          (in_RDI + 0xa8));
    pLVar6 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (in_RDI + 0xa8));
    for (; local_38 != pLVar6; local_38 = local_38 + 1) {
      Solver::markSeen(in_stack_ffffffffffffff48,
                       (Literal)(uint32)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    }
    local_48 = sizeVec<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1b481c);
    local_1c = local_48 + local_1c;
    local_58 = bk_lib::
               pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
               ::begin((pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
                        *)(in_RDI + 0x58));
    pLVar7 = bk_lib::
             pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
             ::end((pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
                    *)(in_RDI + 0x58));
    for (; local_58 != pLVar7 && local_48 != 0; local_58 = local_58 + 1) {
      bVar1 = Solver::seen(in_stack_ffffffffffffff48,
                           (Literal)(uint32)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      if (bVar1) {
        in_stack_ffffffffffffff50 = local_18;
        Literal::var((Literal *)&stack0xffffffffffffff9c);
        uVar2 = Solver::level(in_stack_ffffffffffffff40,
                              (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        if ((*(uint *)(in_RDI + 0xf8) < uVar2) && (uVar2 <= *(uint *)(in_RDI + 0xfc))) {
          if (uVar2 < local_20) {
            local_20 = uVar2;
          }
          in_stack_ffffffffffffff40 = (Solver *)(in_RDI + 0x68);
          LVar3 = Literal::operator~(in_stack_ffffffffffffff38);
          LitPair::LitPair(&local_70,LVar3,local_58->id);
          getData((UncoreMinimize *)in_stack_ffffffffffffff40,
                  (uint32)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          Todo::add((Todo *)in_stack_ffffffffffffff50,(LitPair *)in_stack_ffffffffffffff48,
                    (weight_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
          in_stack_ffffffffffffff48 = local_18;
          Literal::var((Literal *)&stack0xffffffffffffff9c);
          Solver::clearSeen(in_stack_ffffffffffffff40,
                            (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          local_48 = local_48 - 1;
        }
      }
    }
    popPath((UncoreMinimize *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
            (uint32)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    if (local_48 != 0) {
      local_1c = local_1c - local_48;
      local_80 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                           ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                            (in_RDI + 0xa8));
      pLVar6 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                          (in_RDI + 0xa8));
      for (; local_80 != pLVar6; local_80 = local_80 + 1) {
        v = local_18._4_4_;
        Literal::var(local_80);
        Solver::clearSeen(in_stack_ffffffffffffff40,v);
      }
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xa8));
    local_4 = local_1c;
  }
  else {
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

uint32 UncoreMinimize::analyze(Solver& s) {
	uint32 cs    = 0;
	uint32 minDL = s.decisionLevel();
	if (!conflict_.empty()) {
		LitPair p(conflict_[0], conflict_[1].rep());
		assert(s.isTrue(p.lit));
		todo_.add(p, getData(p.id).weight);
		minDL = s.level(p.lit.var());
		cs = 1;
	}
	conflict_.clear();
	if (s.decisionLevel() <= eRoot_) {
		return cs;
	}
	s.resolveToCore(conflict_);
	for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end; ++it) {
		s.markSeen(*it);
	}
	// map marked root decisions back to our assumptions
	uint32 roots = sizeVec(conflict_), dl;
	cs += roots;
	for (LitSet::iterator it = assume_.begin(), end = assume_.end(); it != end && roots; ++it) {
		Literal p = it->lit;
		if (s.seen(p) && (dl = s.level(p.var())) > eRoot_ && dl <= aTop_) {
			assert(p == s.decision(dl) && getData(it->id).assume);
			if (dl < minDL) { minDL = dl; }
			todo_.add(LitPair(~p, it->id), getData(it->id).weight);
			assert(s.isFalse(~p));
			s.clearSeen(p.var());
			--roots;
		}
	}
	popPath(s, minDL - (minDL != 0));
	if (roots) { // clear remaining levels - can only happen if someone messed with our assumptions
		cs -= roots;
		for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end; ++it) { s.clearSeen(it->var()); }
	}
	conflict_.clear();
	return cs;
}